

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5VocabBestIndexMethod(sqlite3_vtab *pUnused,sqlite3_index_info *pInfo)

{
  uchar uVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  uchar *puVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  
  if ((long)pInfo->nConstraint < 1) {
    pInfo->estimatedCost = 1000000.0;
    uVar3 = 0;
  }
  else {
    puVar6 = &pInfo->aConstraint->usable;
    uVar2 = 0xffffffff;
    uVar8 = 0;
    uVar5 = 0xffffffff;
    uVar7 = 0xffffffff;
    do {
      if ((*puVar6 != '\0') && (((sqlite3_index_constraint *)(puVar6 + -5))->iColumn == 0)) {
        uVar1 = puVar6[-1];
        if (uVar1 == '\x02') {
          uVar7 = uVar8 & 0xffffffff;
        }
        if ((uVar1 - 8 & 0xf7) == 0) {
          uVar2 = uVar8 & 0xffffffff;
        }
        if (uVar1 == ' ') {
          uVar5 = uVar8 & 0xffffffff;
        }
        if (uVar1 == '\x04') {
          uVar5 = uVar8 & 0xffffffff;
        }
      }
      uVar8 = uVar8 + 1;
      puVar6 = puVar6 + 0xc;
    } while ((long)pInfo->nConstraint != uVar8);
    if ((int)uVar7 < 0) {
      pInfo->estimatedCost = 1000000.0;
      if ((int)uVar5 < 0) {
        iVar4 = 1;
        uVar3 = 0;
        dVar9 = 500000.0;
      }
      else {
        pInfo->aConstraintUsage[uVar5].argvIndex = 1;
        pInfo->estimatedCost = 500000.0;
        uVar3 = 2;
        dVar9 = 250000.0;
        iVar4 = 2;
      }
      if (-1 < (int)uVar2) {
        uVar3 = uVar3 | 4;
        pInfo->aConstraintUsage[uVar2].argvIndex = iVar4;
        pInfo->estimatedCost = dVar9;
      }
    }
    else {
      pInfo->aConstraintUsage[uVar7].argvIndex = 1;
      pInfo->estimatedCost = 100.0;
      uVar3 = 1;
    }
  }
  if (((pInfo->nOrderBy == 1) && (pInfo->aOrderBy->iColumn == 0)) && (pInfo->aOrderBy->desc == '\0')
     ) {
    pInfo->orderByConsumed = 1;
  }
  pInfo->idxNum = uVar3;
  return 0;
}

Assistant:

static int fts5VocabBestIndexMethod(
  sqlite3_vtab *pUnused,
  sqlite3_index_info *pInfo
){
  int i;
  int iTermEq = -1;
  int iTermGe = -1;
  int iTermLe = -1;
  int idxNum = 0;
  int nArg = 0;

  UNUSED_PARAM(pUnused);

  for(i=0; i<pInfo->nConstraint; i++){
    struct sqlite3_index_constraint *p = &pInfo->aConstraint[i];
    if( p->usable==0 ) continue;
    if( p->iColumn==0 ){          /* term column */
      if( p->op==SQLITE_INDEX_CONSTRAINT_EQ ) iTermEq = i;
      if( p->op==SQLITE_INDEX_CONSTRAINT_LE ) iTermLe = i;
      if( p->op==SQLITE_INDEX_CONSTRAINT_LT ) iTermLe = i;
      if( p->op==SQLITE_INDEX_CONSTRAINT_GE ) iTermGe = i;
      if( p->op==SQLITE_INDEX_CONSTRAINT_GT ) iTermGe = i;
    }
  }

  if( iTermEq>=0 ){
    idxNum |= FTS5_VOCAB_TERM_EQ;
    pInfo->aConstraintUsage[iTermEq].argvIndex = ++nArg;
    pInfo->estimatedCost = 100;
  }else{
    pInfo->estimatedCost = 1000000;
    if( iTermGe>=0 ){
      idxNum |= FTS5_VOCAB_TERM_GE;
      pInfo->aConstraintUsage[iTermGe].argvIndex = ++nArg;
      pInfo->estimatedCost = pInfo->estimatedCost / 2;
    }
    if( iTermLe>=0 ){
      idxNum |= FTS5_VOCAB_TERM_LE;
      pInfo->aConstraintUsage[iTermLe].argvIndex = ++nArg;
      pInfo->estimatedCost = pInfo->estimatedCost / 2;
    }
  }

  /* This virtual table always delivers results in ascending order of
  ** the "term" column (column 0). So if the user has requested this
  ** specifically - "ORDER BY term" or "ORDER BY term ASC" - set the
  ** sqlite3_index_info.orderByConsumed flag to tell the core the results
  ** are already in sorted order.  */
  if( pInfo->nOrderBy==1 
   && pInfo->aOrderBy[0].iColumn==0 
   && pInfo->aOrderBy[0].desc==0
  ){
    pInfo->orderByConsumed = 1;
  }

  pInfo->idxNum = idxNum;
  return SQLITE_OK;
}